

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBackUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  uint uVar1;
  int length_00;
  uint8_t *puVar2;
  int32_t *piVar3;
  UBool UVar4;
  int32_t length_01;
  int32_t iVar5;
  uint8_t *t;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = this->strings->count;
  lVar6 = 0;
  if (this->all != '\0') {
    lVar6 = (long)(int)uVar1 * 3;
  }
  puVar2 = this->spanLengths;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  while( true ) {
    length_01 = UnicodeSet::spanBackUTF8(this->pSpanNotSet,(char *)s,length,USET_SPAN_NOT_CONTAINED)
    ;
    if (length_01 == 0) {
      return 0;
    }
    iVar5 = spanOneBackUTF8(&this->spanSet,s,length_01);
    if (0 < iVar5) break;
    piVar3 = this->utf8Lengths;
    t = this->utf8;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      length_00 = piVar3[uVar9];
      lVar7 = (long)length_00;
      if ((((lVar7 != 0) && (length_00 <= length_01)) && (puVar2[uVar9 + lVar6] != 0xff)) &&
         (UVar4 = matches8(s + (length_01 - lVar7),t,length_00), UVar4 != '\0')) {
        return length_01;
      }
      t = t + lVar7;
    }
    length = iVar5 + length_01;
    if (length == 0) {
      return 0;
    }
  }
  return length_01;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBackUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBackUTF8((const char *)s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBackUTF8(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanBackUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=pos && matches8(s+pos-length8, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}